

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SongListModel.cpp
# Opt level: O0

int __thiscall SongListModel::remove(SongListModel *this,char *__filename)

{
  int extraout_EAX;
  Module *this_00;
  Song *song;
  int index;
  __normal_iterator<SongListModel::SongMeta_*,_std::vector<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>_>
  local_80;
  __normal_iterator<SongListModel::SongMeta_*,_std::vector<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>_>
  local_78;
  const_iterator local_70;
  SongList *local_58;
  SongList *songs;
  PermanentEditor editor;
  Song *removedSong;
  int index_local;
  SongListModel *this_local;
  
  index = (int)__filename;
  QModelIndex::QModelIndex((QModelIndex *)&editor.mModule);
  QAbstractItemModel::beginRemoveRows((QModelIndex *)this,(int)&editor.mModule,index);
  Module::permanentEdit((PermanentEditor *)&songs,this->mModule);
  this_00 = Module::data(this->mModule);
  local_58 = trackerboy::Module::songs(this_00);
  song = trackerboy::SongList::get(local_58,index);
  trackerboy::SongList::remove(local_58,(char *)((ulong)__filename & 0xffffffff));
  local_80._M_current =
       (SongMeta *)
       std::vector<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>::begin
                 (&this->mSongData);
  local_78 = __gnu_cxx::
             __normal_iterator<SongListModel::SongMeta_*,_std::vector<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>_>
             ::operator+(&local_80,(long)index);
  __gnu_cxx::
  __normal_iterator<SongListModel::SongMeta_const*,std::vector<SongListModel::SongMeta,std::allocator<SongListModel::SongMeta>>>
  ::__normal_iterator<SongListModel::SongMeta*>
            ((__normal_iterator<SongListModel::SongMeta_const*,std::vector<SongListModel::SongMeta,std::allocator<SongListModel::SongMeta>>>
              *)&local_70,&local_78);
  std::vector<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>::erase
            (&this->mSongData,local_70);
  Module::PermanentEditor::~PermanentEditor((PermanentEditor *)&songs);
  QAbstractItemModel::endRemoveRows();
  Module::removeHistory(this->mModule,song);
  return extraout_EAX;
}

Assistant:

void SongListModel::remove(int index) {
    trackerboy::Song *removedSong;
    beginRemoveRows(QModelIndex(), index, index);
    {
        auto editor = mModule.permanentEdit();
        auto &songs = mModule.data().songs();
        removedSong = songs.get(index);
        songs.remove(index);
        mSongData.erase(mSongData.begin() + index);
    }

    endRemoveRows();

    // now remove the history for the song (if exists)
    mModule.removeHistory(removedSong);
}